

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_pkp_pin_peer_pubkey(Curl_easy *data,X509 *cert,char *pinnedpubkey)

{
  X509_PUBKEY *pXVar1;
  CURLcode local_44;
  uchar *puStack_40;
  CURLcode result;
  uchar *temp;
  uchar *buff1;
  int len2;
  int len1;
  char *pinnedpubkey_local;
  X509 *cert_local;
  Curl_easy *data_local;
  
  buff1._4_4_ = 0;
  buff1._0_4_ = 0;
  temp = (uchar *)0x0;
  puStack_40 = (uchar *)0x0;
  local_44 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  if (pinnedpubkey == (char *)0x0) {
    data_local._4_4_ = CURLE_OK;
  }
  else if (cert == (X509 *)0x0) {
    data_local._4_4_ = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
  }
  else {
    _len2 = pinnedpubkey;
    pinnedpubkey_local = (char *)cert;
    cert_local = (X509 *)data;
    pXVar1 = (X509_PUBKEY *)X509_get_X509_PUBKEY(cert);
    buff1._4_4_ = i2d_X509_PUBKEY(pXVar1,(uchar **)0x0);
    if ((0 < buff1._4_4_) &&
       (puStack_40 = (uchar *)(*Curl_cmalloc)((long)buff1._4_4_), temp = puStack_40,
       puStack_40 != (uchar *)0x0)) {
      pXVar1 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pinnedpubkey_local);
      buff1._0_4_ = i2d_X509_PUBKEY(pXVar1,&stack0xffffffffffffffc0);
      if ((buff1._4_4_ == (int)buff1) &&
         ((puStack_40 != (uchar *)0x0 && ((long)puStack_40 - (long)temp == (long)buff1._4_4_)))) {
        local_44 = Curl_pin_peer_pubkey((Curl_easy *)cert_local,_len2,temp,(long)buff1._4_4_);
      }
    }
    if (temp != (uchar *)0x0) {
      (*Curl_cfree)(temp);
    }
    data_local._4_4_ = local_44;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_pkp_pin_peer_pubkey(struct Curl_easy *data, X509* cert,
                                         const char *pinnedpubkey)
{
  /* Scratch */
  int len1 = 0, len2 = 0;
  unsigned char *buff1 = NULL, *temp = NULL;

  /* Result is returned to caller */
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;

  /* if a path wasn't specified, don't pin */
  if(!pinnedpubkey)
    return CURLE_OK;

  if(!cert)
    return result;

  do {
    /* Begin Gyrations to get the subjectPublicKeyInfo     */
    /* Thanks to Viktor Dukhovni on the OpenSSL mailing list */

    /* https://groups.google.com/group/mailing.openssl.users/browse_thread
       /thread/d61858dae102c6c7 */
    len1 = i2d_X509_PUBKEY(X509_get_X509_PUBKEY(cert), NULL);
    if(len1 < 1)
      break; /* failed */

    buff1 = temp = malloc(len1);
    if(!buff1)
      break; /* failed */

    /* https://www.openssl.org/docs/crypto/d2i_X509.html */
    len2 = i2d_X509_PUBKEY(X509_get_X509_PUBKEY(cert), &temp);

    /*
     * These checks are verifying we got back the same values as when we
     * sized the buffer. It's pretty weak since they should always be the
     * same. But it gives us something to test.
     */
    if((len1 != len2) || !temp || ((temp - buff1) != len1))
      break; /* failed */

    /* End Gyrations */

    /* The one good exit point */
    result = Curl_pin_peer_pubkey(data, pinnedpubkey, buff1, len1);
  } while(0);

  if(buff1)
    free(buff1);

  return result;
}